

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

doorindex_t * get_nearest_door(tgestate_t *state)

{
  int iVar1;
  door_t *pdVar2;
  tgestate_t *in_RDI;
  doorindex_t interior_door_index;
  mappos16_t *mappos;
  doorindex_t *interior_doors;
  doorindex_t locked_door_index;
  door_t *door;
  uint8_t iters;
  doorindex_t *locked_doors;
  doorindex_t *local_38;
  char local_19;
  doorindex_t *local_18;
  
  if (in_RDI->room_index == '\0') {
    local_18 = in_RDI->locked_doors;
    local_19 = '\x05';
    do {
      pdVar2 = get_door(*local_18 & 0x7f);
      iVar1 = door_in_range(in_RDI,pdVar2);
      if ((iVar1 == 0) || (iVar1 = door_in_range(in_RDI,pdVar2 + 1), iVar1 == 0)) {
        return local_18;
      }
      local_18 = local_18 + 1;
      local_19 = local_19 + -1;
    } while (local_19 != '\0');
  }
  else {
    local_18 = in_RDI->locked_doors + 2;
    local_19 = '\b';
    do {
      for (local_38 = in_RDI->interior_doors; *local_38 != 0xff; local_38 = local_38 + 1) {
        if ((*local_38 & 0x7f) == (*local_18 & 0x7f)) {
          pdVar2 = get_door(*local_38);
          if (((((int)((pdVar2->mappos).u - 3) < (int)(uint)(in_RDI->saved_mappos).pos16.u) &&
               ((in_RDI->saved_mappos).pos16.u <= (ushort)((pdVar2->mappos).u + 3))) &&
              ((int)((pdVar2->mappos).v - 3) < (int)(uint)(in_RDI->saved_mappos).pos16.v)) &&
             ((in_RDI->saved_mappos).pos16.v <= (ushort)((pdVar2->mappos).v + 3))) {
            return local_18;
          }
          break;
        }
      }
      local_18 = local_18 + 1;
      local_19 = local_19 + -1;
    } while (local_19 != '\0');
  }
  return (doorindex_t *)0x0;
}

Assistant:

doorindex_t *get_nearest_door(tgestate_t *state)
{
  doorindex_t  *locked_doors;         /* was HL */
  uint8_t       iters;                /* was B */
  const door_t *door;                 /* was HL' */
  doorindex_t   locked_door_index;    /* was C */
  doorindex_t  *interior_doors;       /* was DE */
  mappos16_t   *mappos;               /* was DE' */
  doorindex_t   interior_door_index;  /* was A */

  assert(state != NULL);

  if (state->room_index == room_0_OUTDOORS)
  {
    /* Outdoors. */

    /* Locked doors 0..4 include exterior doors. */
    locked_doors = &state->locked_doors[0];
    iters = 5;
    do
    {
      door = get_door(*locked_doors & ~door_LOCKED); // Conv: A used as temporary.
      if (door_in_range(state, door + 0) == 0 ||
          door_in_range(state, door + 1) == 0)
        return locked_doors; /* Conv: goto removed. */

      locked_doors++;
    }
    while (--iters);

    return NULL; /* Not found */
  }
  else
  {
    /* Indoors. */

    /* Locked doors 2..8 include interior doors. */
    locked_doors = &state->locked_doors[2];
    iters = 8; // BUG: iters should be 7
    do
    {
      locked_door_index = *locked_doors & ~door_LOCKED;

      /* Search interior_doors[] for door_index. */
      for (interior_doors = &state->interior_doors[0]; ; interior_doors++)
      {
        interior_door_index = *interior_doors;
        if (interior_door_index == interiordoor_NONE)
          break; /* end of list */

        if ((interior_door_index & ~door_REVERSE) == locked_door_index) // this must be door_REVERSE as it came from interior_doors[]
          goto found;

        /* There's no termination condition here where you might expect a
         * test to see if we've run out of doors, but since every room has
         * at least one door it *must* find one. */
      }

next_locked_door:
      locked_doors++;
    }
    while (--iters);

    return NULL; /* Not found */


    // FUTURE: Move this into the body of the loop.
found:
    door = get_door(*interior_doors);
    /* Range check pattern (-2..+3). */
    mappos = &state->saved_mappos.pos16; // note: 16-bit values holding 8-bit values
    // Conv: Unrolled.
    if (mappos->u <= door->mappos.u - 3 || mappos->u > door->mappos.u + 3 ||
        mappos->v <= door->mappos.v - 3 || mappos->v > door->mappos.v + 3)
      goto next_locked_door;

    return locked_doors;
  }
}